

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

int __thiscall
icu_63::TimeArrayTimeZoneRule::clone
          (TimeArrayTimeZoneRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeArrayTimeZoneRule *this_00;
  
  this_00 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)__fn);
  if (this_00 == (TimeArrayTimeZoneRule *)0x0) {
    this_00 = (TimeArrayTimeZoneRule *)0x0;
  }
  else {
    TimeArrayTimeZoneRule(this_00,this);
  }
  return (int)this_00;
}

Assistant:

TimeArrayTimeZoneRule*
TimeArrayTimeZoneRule::clone(void) const {
    return new TimeArrayTimeZoneRule(*this);
}